

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void sfImage::preview_image(path *image_path,size_t width)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  size_t sVar4;
  char cVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_00;
  string __str;
  allocator_type local_d9;
  long *local_d8;
  uint local_d0;
  long local_c8 [2];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_b8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_a0;
  long *local_88;
  undefined8 local_80;
  long local_78 [2];
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined8 local_58;
  long *plStack_50;
  undefined8 local_48;
  char *pcStack_40;
  long *local_30;
  
  local_48 = 0x1f;
  pcStack_40 = "command -v viu > /dev/null 2>&1";
  local_58 = 2;
  plStack_50 = (long *)0x13482d;
  local_68._M_len = 2;
  local_68._M_str = "sh";
  __l._M_len = 3;
  __l._M_array = &local_68;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_a0,__l,(allocator_type *)&local_88);
  bVar3 = sfUtils::taur_exec(&local_a0);
  if (local_a0.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar3) {
    local_68._M_len = 3;
    local_68._M_str = "viu";
    pcVar1 = (image_path->_M_pathname)._M_dataplus._M_p;
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,pcVar1,pcVar1 + (image_path->_M_pathname)._M_string_length);
    local_58 = local_80;
    plStack_50 = local_88;
    local_48 = 2;
    pcStack_40 = "-w";
    cVar5 = '\x01';
    if (9 < width) {
      sVar4 = width;
      cVar2 = '\x04';
      do {
        cVar5 = cVar2;
        if (sVar4 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_001137c3;
        }
        if (sVar4 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_001137c3;
        }
        if (sVar4 < 10000) goto LAB_001137c3;
        bVar3 = 99999 < sVar4;
        sVar4 = sVar4 / 10000;
        cVar2 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_001137c3:
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct((ulong)&local_d8,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d8,local_d0,width);
    local_30 = local_d8;
    __l_00._M_len = 4;
    __l_00._M_array = &local_68;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&local_b8,__l_00,&local_d9);
    sfUtils::taur_exec(&local_b8);
    if (local_b8.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
  }
  return;
}

Assistant:

void sfImage::preview_image(const std::filesystem::path& image_path, const size_t width) {
  /* Check if `viu` is installed in the system */
  if (sfUtils::taur_exec({ "sh", "-c", "command -v viu > /dev/null 2>&1" })) {
    sfUtils::taur_exec({"viu", image_path.string(), "-w", std::to_string(width)});
  }

  return;
}